

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

void Emb_ManDumpGnuplot(Emb_Man_t *p,char *pName,int fDumpLarge,int fShowImage)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  char *pcVar6;
  FILE *__stream;
  Vec_Int_t *__ptr;
  uint uVar7;
  long lVar8;
  size_t __size;
  ulong uVar9;
  ulong uVar10;
  char Buffer [1000];
  
  if (p->pPlacement == (unsigned_short *)0x0) {
    puts("Emb_ManDumpGnuplot(): Placement is not available.");
    return;
  }
  pcVar6 = Gia_FileNameGenericAppend(pName,".plt");
  sprintf(Buffer,"%s%s","",pcVar6);
  __stream = fopen(Buffer,"w");
  pcVar6 = Ioa_TimeStamp();
  fprintf(__stream,"# This Gnuplot file was produced by ABC on %s\n",pcVar6);
  fputc(10,__stream);
  fwrite("set nokey\n",10,1,__stream);
  fputc(10,__stream);
  if (fShowImage == 0) {
    fwrite("set terminal gif font \'arial\' 10 size 800,600 xffffff x000000 x000000 x000000\n",0x4e,
           1,__stream);
    pcVar6 = Gia_FileNameGenericAppend(pName,".gif");
    fprintf(__stream,"set output \'%s\'\n",pcVar6);
    fputc(10,__stream);
  }
  iVar2 = p->vCis->nSize;
  uVar7 = p->nRegs;
  iVar3 = p->vCos->nSize;
  uVar4 = p->nObjs;
  Emb_ManComputeHPWL(p);
  fprintf(__stream,
          "set title \"%s :  PI = %d   PO = %d   FF = %d   Node = %d   Obj = %d  HPWL = %.2e\\n",
          pName,(ulong)(iVar2 - uVar7),(ulong)(iVar3 - uVar7),(ulong)uVar7,
          (ulong)(uVar4 - (iVar3 + iVar2)),(ulong)uVar4);
  pcVar6 = Ioa_TimeStamp();
  fprintf(__stream,"(image generated by ABC and Gnuplot on %s)\"",pcVar6);
  fwrite("font \"Times, 12\"\n",0x11,1,__stream);
  fputc(10,__stream);
  fwrite("plot [:] \'-\' w l\n",0x11,1,__stream);
  fputc(10,__stream);
  if (fDumpLarge == 0) {
    if (0 < p->nObjData) {
      uVar10 = 0;
      do {
        if (p->pObjData == (int *)0x0) break;
        puVar1 = (uint *)(p->pObjData + uVar10);
        if ((puVar1[3] == p->nTravIds) && (0 < (int)puVar1[1])) {
          lVar8 = 0;
          do {
            uVar7 = puVar1[(ulong)(*puVar1 >> 4) + lVar8 + 5];
            if (puVar1[(long)(int)uVar7 + 3] != p->nTravIds) {
              __assert_fail("Emb_ObjIsTravIdCurrent(p, pNext)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                            ,0x6da,"void Emb_ManDumpGnuplot(Emb_Man_t *, char *, int, int)");
            }
            fprintf(__stream,"%5d %5d\n",(ulong)p->pPlacement[puVar1[4] * 2],
                    (ulong)p->pPlacement[(ulong)(puVar1[4] * 2) + 1]);
            fprintf(__stream,"%5d %5d\n",(ulong)p->pPlacement[puVar1[(long)(int)uVar7 + 4] * 2],
                    (ulong)p->pPlacement[(ulong)(puVar1[(long)(int)uVar7 + 4] * 2) + 1]);
            fputc(10,__stream);
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 < (int)puVar1[1]);
        }
        uVar7 = (int)uVar10 + (*puVar1 >> 4) + puVar1[1] + 5;
        uVar10 = (ulong)uVar7;
      } while ((int)uVar7 < p->nObjData);
    }
  }
  else {
    __ptr = Emb_ManDumpGnuplotPrepare(p);
    iVar2 = __ptr->nSize;
    uVar10 = (ulong)iVar2;
    if (0 < (long)uVar10) {
      piVar5 = __ptr->pArray;
      uVar9 = 3;
      do {
        if (((uVar10 <= uVar9 - 2) || (uVar10 <= uVar9 - 1)) || (uVar10 <= uVar9)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar7 = piVar5[uVar9 - 1];
        uVar4 = piVar5[uVar9];
        fprintf(__stream,"%5d %5d\n",(ulong)(uint)piVar5[uVar9 - 3],(ulong)(uint)piVar5[uVar9 - 2]);
        fprintf(__stream,"%5d %5d\n",(ulong)uVar7,(ulong)uVar4);
        fputc(10,__stream);
        iVar3 = (int)uVar9;
        uVar9 = uVar9 + 4;
      } while (iVar3 + 1 < iVar2);
    }
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    if (__ptr != (Vec_Int_t *)0x0) {
      free(__ptr);
    }
  }
  fwrite("EOF\n",4,1,__stream);
  fputc(10,__stream);
  if (fShowImage == 0) {
    fwrite("# pause -1 \"Close window\"\n",0x1a,1,__stream);
    pcVar6 = "# reset\n";
    __size = 8;
  }
  else {
    fwrite("pause -1 \"Close window\"\n",0x18,1,__stream);
    pcVar6 = "reset\n";
    __size = 6;
  }
  fwrite(pcVar6,__size,1,__stream);
  fputc(10,__stream);
  fclose(__stream);
  if (fShowImage != 0) {
    Gia_ManGnuplotShow(Buffer);
  }
  return;
}

Assistant:

void Emb_ManDumpGnuplot( Emb_Man_t * p, char * pName, int fDumpLarge, int fShowImage )
{
    extern void Gia_ManGnuplotShow( char * pPlotFileName );
//    char * pDirectory = "place\\";
    char * pDirectory = "";
//    extern char * Ioa_TimeStamp();
    FILE * pFile;
    char Buffer[1000];
    Emb_Obj_t * pThis, * pNext;
    int i, k;
    if ( p->pPlacement == NULL )
    {
        printf( "Emb_ManDumpGnuplot(): Placement is not available.\n" );
        return;
    }
    sprintf( Buffer, "%s%s", pDirectory, Gia_FileNameGenericAppend(pName, ".plt") ); 
    pFile = fopen( Buffer, "w" );
    fprintf( pFile, "# This Gnuplot file was produced by ABC on %s\n", Ioa_TimeStamp() );
    fprintf( pFile, "\n" );
    fprintf( pFile, "set nokey\n" );
    fprintf( pFile, "\n" );
    if ( !fShowImage )
    {
//    fprintf( pFile, "set terminal postscript\n" );
    fprintf( pFile, "set terminal gif font \'arial\' 10 size 800,600 xffffff x000000 x000000 x000000\n" );
    fprintf( pFile, "set output \'%s\'\n", Gia_FileNameGenericAppend(pName, ".gif") );
    fprintf( pFile, "\n" );
    }
    fprintf( pFile, "set title \"%s :  PI = %d   PO = %d   FF = %d   Node = %d   Obj = %d  HPWL = %.2e\\n", 
        pName, Emb_ManPiNum(p), Emb_ManPoNum(p), Emb_ManRegNum(p), Emb_ManNodeNum(p), Emb_ManObjNum(p), Emb_ManComputeHPWL(p) );
    fprintf( pFile, "(image generated by ABC and Gnuplot on %s)\"", Ioa_TimeStamp() );
    fprintf( pFile, "font \"Times, 12\"\n" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "plot [:] '-' w l\n" );
    fprintf( pFile, "\n" );
    if ( fDumpLarge )
    {
        int begX, begY, endX, endY;
        Vec_Int_t * vLines = Emb_ManDumpGnuplotPrepare( p );
        Vec_IntForEachEntry( vLines, begX, i )
        {
            begY = Vec_IntEntry( vLines, i+1 );
            endX = Vec_IntEntry( vLines, i+2 );
            endY = Vec_IntEntry( vLines, i+3 );
            i += 3;
            fprintf( pFile, "%5d %5d\n", begX, begY );
            fprintf( pFile, "%5d %5d\n", endX, endY );
            fprintf( pFile, "\n" );
        }
        Vec_IntFree( vLines );
    }
    else
    {
        Emb_ManForEachObj( p, pThis, i )
        {
            if ( !Emb_ObjIsTravIdCurrent(p, pThis) )
                continue;
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                assert( Emb_ObjIsTravIdCurrent(p, pNext) );
                fprintf( pFile, "%5d %5d\n", p->pPlacement[2*pThis->Value+0], p->pPlacement[2*pThis->Value+1] );
                fprintf( pFile, "%5d %5d\n", p->pPlacement[2*pNext->Value+0], p->pPlacement[2*pNext->Value+1] );
                fprintf( pFile, "\n" );
            }
        }
    }
    fprintf( pFile, "EOF\n" );
    fprintf( pFile, "\n" );
    if ( fShowImage )
    {
    fprintf( pFile, "pause -1 \"Close window\"\n" );  // Hit return to continue
    fprintf( pFile, "reset\n" );
    fprintf( pFile, "\n" );
    }
    else
    {
    fprintf( pFile, "# pause -1 \"Close window\"\n" );  // Hit return to continue
    fprintf( pFile, "# reset\n" );
    fprintf( pFile, "\n" );
    }
    fclose( pFile );
    if ( fShowImage )
        Gia_ManGnuplotShow( Buffer );
}